

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::CopyProducerPageIntoLogBuffer
          (TracingServiceImpl *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,BufferID buffer_id,
          uint16_t num_fragments,uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  bool bVar1;
  ProducerEndpointImpl *this_00;
  TraceBuffer *this_01;
  char *pcVar2;
  Optional<unsigned_short> associated_buffer;
  
  this_00 = GetProducer(this,producer_id_trusted);
  if (this_00 != (ProducerEndpointImpl *)0x0) {
    this_01 = GetBufferByID(this,buffer_id);
    if (this_01 != (TraceBuffer *)0x0) {
      bVar1 = ProducerEndpointImpl::is_allowed_target_buffer(this_00,buffer_id);
      if (bVar1) {
        ProducerEndpointImpl::buffer_id_for_writer
                  ((ProducerEndpointImpl *)&associated_buffer,(WriterID)this_00);
        if ((associated_buffer.super_OptionalBase<unsigned_short>.storage_.
             super_OptionalStorageBase<unsigned_short,_true>.is_populated_ != true) ||
           (associated_buffer.super_OptionalBase<unsigned_short>.storage_.
            super_OptionalStorageBase<unsigned_short,_true>.field_1.value_ == buffer_id)) {
          TraceBuffer::CopyChunkUntrusted
                    (this_01,producer_id_trusted,producer_uid_trusted,producer_pid_trusted,writer_id
                     ,chunk_id,num_fragments,chunk_flags,chunk_complete,src,size);
          return;
        }
        pcVar2 = base::Basename(
                               "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                               );
        base::LogMessage(kLogError,pcVar2,0xe5d9,
                         "Writer %u of producer %u was registered to write into target buffer %u, but tried to write into buffer %u"
                         ,(ulong)writer_id,(ulong)producer_id_trusted,
                         (ulong)associated_buffer.super_OptionalBase<unsigned_short>.storage_.
                                super_OptionalStorageBase<unsigned_short,_true>.field_1.value_,
                         (ulong)buffer_id);
      }
      else {
        pcVar2 = base::Basename(
                               "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                               );
        base::LogMessage(kLogError,pcVar2,0xe5ca,
                         "Producer %u tried to write into forbidden target buffer %u",
                         (ulong)producer_id_trusted,(ulong)buffer_id);
      }
    }
  }
  this->chunks_discarded_ = this->chunks_discarded_ + 1;
  return;
}

Assistant:

void TracingServiceImpl::CopyProducerPageIntoLogBuffer(
    ProducerID producer_id_trusted,
    uid_t producer_uid_trusted,
    pid_t producer_pid_trusted,
    WriterID writer_id,
    ChunkID chunk_id,
    BufferID buffer_id,
    uint16_t num_fragments,
    uint8_t chunk_flags,
    bool chunk_complete,
    const uint8_t* src,
    size_t size) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  ProducerEndpointImpl* producer = GetProducer(producer_id_trusted);
  if (!producer) {
    PERFETTO_DFATAL("Producer not found.");
    chunks_discarded_++;
    return;
  }

  TraceBuffer* buf = GetBufferByID(buffer_id);
  if (!buf) {
    PERFETTO_DLOG("Could not find target buffer %" PRIu16
                  " for producer %" PRIu16,
                  buffer_id, producer_id_trusted);
    chunks_discarded_++;
    return;
  }

  // Verify that the producer is actually allowed to write into the target
  // buffer specified in the request. This prevents a malicious producer from
  // injecting data into a log buffer that belongs to a tracing session the
  // producer is not part of.
  if (!producer->is_allowed_target_buffer(buffer_id)) {
    PERFETTO_ELOG("Producer %" PRIu16
                  " tried to write into forbidden target buffer %" PRIu16,
                  producer_id_trusted, buffer_id);
    PERFETTO_DFATAL("Forbidden target buffer");
    chunks_discarded_++;
    return;
  }

  // If the writer was registered by the producer, it should only write into the
  // buffer it was registered with.
  base::Optional<BufferID> associated_buffer =
      producer->buffer_id_for_writer(writer_id);
  if (associated_buffer && *associated_buffer != buffer_id) {
    PERFETTO_ELOG("Writer %" PRIu16 " of producer %" PRIu16
                  " was registered to write into target buffer %" PRIu16
                  ", but tried to write into buffer %" PRIu16,
                  writer_id, producer_id_trusted, *associated_buffer,
                  buffer_id);
    PERFETTO_DFATAL("Wrong target buffer");
    chunks_discarded_++;
    return;
  }

  buf->CopyChunkUntrusted(producer_id_trusted, producer_uid_trusted,
                          producer_pid_trusted, writer_id, chunk_id,
                          num_fragments, chunk_flags, chunk_complete, src,
                          size);
}